

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeCallQueue.cpp
# Opt level: O2

CallReader * xe::operator>>(CallReader *reader,string *value)

{
  undefined8 in_RAX;
  size_t in_RCX;
  undefined8 uStack_28;
  char c;
  
  value->_M_string_length = 0;
  *(value->_M_dataplus)._M_p = '\0';
  uStack_28 = in_RAX;
  while( true ) {
    CallReader::read(reader,(int)&c,(void *)0x1,in_RCX);
    if (c == '\0') break;
    std::__cxx11::string::push_back((char)value);
  }
  return reader;
}

Assistant:

CallReader& operator>> (CallReader& reader, std::string& value)
{
	value.clear();
	for (;;)
	{
		char c;
		reader.read((deUint8*)&c, sizeof(char));
		if (c != 0)
			value.push_back(c);
		else
			break;
	}

	return reader;
}